

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::BVHNIntersector1<8,_257,_true,_embree::avx::VirtualCurveIntersector1>::intersect
               (Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float fVar1;
  float fVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined8 uVar20;
  undefined8 uVar21;
  bool bVar22;
  int iVar23;
  ulong uVar24;
  ulong uVar25;
  long lVar26;
  ulong uVar27;
  undefined1 (*pauVar28) [16];
  long lVar29;
  undefined1 (*pauVar30) [16];
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  undefined4 uVar34;
  ulong unaff_R13;
  undefined1 (*pauVar35) [16];
  undefined1 (*pauVar36) [16];
  undefined1 auVar37 [64];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  undefined1 auVar43 [32];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  undefined1 auVar50 [32];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar58;
  float fVar59;
  float fVar60;
  float fVar61;
  undefined1 auVar57 [32];
  float fVar62;
  vfloat4 a0;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar79 [64];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [32];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  float fVar88;
  undefined1 auVar89 [32];
  float fVar91;
  float fVar92;
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  undefined1 auVar90 [64];
  float fVar97;
  undefined1 auVar98 [32];
  float fVar100;
  float fVar101;
  float fVar102;
  float fVar103;
  float fVar104;
  float fVar105;
  undefined1 auVar99 [64];
  float fVar106;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  float fVar110;
  float fVar111;
  float fVar112;
  float fVar113;
  float fVar114;
  float fVar115;
  undefined1 auVar109 [64];
  undefined1 auVar116 [64];
  undefined1 auVar117 [32];
  undefined1 auVar118 [64];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [64];
  vfloat<8> tNear;
  Precalculations pre;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2560 [32];
  undefined1 local_2540 [32];
  undefined1 local_2520 [32];
  undefined1 local_2500 [32];
  undefined1 local_24e0 [32];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  float local_2460 [4];
  undefined1 local_2450 [16];
  undefined1 local_2440 [16];
  undefined1 local_2430 [16];
  undefined1 local_2420 [32];
  undefined1 local_2400 [8];
  float fStack_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  undefined1 local_23e0 [8];
  float fStack_23d8;
  float fStack_23d4;
  float fStack_23d0;
  float fStack_23cc;
  float fStack_23c8;
  float fStack_23c4;
  undefined1 local_23c0 [8];
  float fStack_23b8;
  float fStack_23b4;
  float fStack_23b0;
  float fStack_23ac;
  float fStack_23a8;
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  undefined1 auVar68 [32];
  undefined1 auVar74 [32];
  undefined1 auVar78 [32];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    aVar3 = (ray->super_RayK<1>).dir.field_0.field_1;
    auVar38 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
    auVar39 = vrsqrtss_avx(auVar38,auVar38);
    fVar62 = auVar39._0_4_;
    local_2460[0] = fVar62 * 1.5 - auVar38._0_4_ * 0.5 * fVar62 * fVar62 * fVar62;
    auVar40 = vshufps_avx(ZEXT416((uint)local_2460[0]),ZEXT416((uint)local_2460[0]),0);
    auVar63._0_4_ = aVar3.x * auVar40._0_4_;
    auVar63._4_4_ = aVar3.y * auVar40._4_4_;
    auVar63._8_4_ = aVar3.z * auVar40._8_4_;
    auVar63._12_4_ = aVar3.field_3.w * auVar40._12_4_;
    auVar39 = vshufpd_avx(auVar63,auVar63,1);
    auVar38 = vmovshdup_avx(auVar63);
    auVar83._8_4_ = 0x80000000;
    auVar83._0_8_ = 0x8000000080000000;
    auVar83._12_4_ = 0x80000000;
    auVar69._12_4_ = 0;
    auVar69._0_12_ = ZEXT812(0);
    auVar69 = auVar69 << 0x20;
    auVar80 = vunpckhps_avx(auVar63,auVar69);
    auVar75 = vshufps_avx(auVar80,ZEXT416(auVar38._0_4_ ^ 0x80000000),0x41);
    auVar80._0_8_ = auVar39._0_8_ ^ 0x8000000080000000;
    auVar80._8_8_ = auVar83._8_8_ ^ auVar39._8_8_;
    auVar80 = vinsertps_avx(auVar80,auVar63,0x2a);
    auVar38 = vdpps_avx(auVar75,auVar75,0x7f);
    auVar39 = vdpps_avx(auVar80,auVar80,0x7f);
    auVar38 = vcmpps_avx(auVar39,auVar38,1);
    auVar38 = vshufps_avx(auVar38,auVar38,0);
    auVar38 = vblendvps_avx(auVar80,auVar75,auVar38);
    auVar39 = vdpps_avx(auVar38,auVar38,0x7f);
    auVar80 = vrsqrtss_avx(auVar39,auVar39);
    fVar62 = auVar80._0_4_;
    auVar39 = ZEXT416((uint)(fVar62 * 1.5 - auVar39._0_4_ * 0.5 * fVar62 * fVar62 * fVar62));
    auVar39 = vshufps_avx(auVar39,auVar39,0);
    auVar75._0_4_ = auVar38._0_4_ * auVar39._0_4_;
    auVar75._4_4_ = auVar38._4_4_ * auVar39._4_4_;
    auVar75._8_4_ = auVar38._8_4_ * auVar39._8_4_;
    auVar75._12_4_ = auVar38._12_4_ * auVar39._12_4_;
    auVar38 = vshufps_avx(auVar75,auVar75,0xc9);
    auVar39 = vshufps_avx(auVar63,auVar63,0xc9);
    auVar84._0_4_ = auVar39._0_4_ * auVar75._0_4_;
    auVar84._4_4_ = auVar39._4_4_ * auVar75._4_4_;
    auVar84._8_4_ = auVar39._8_4_ * auVar75._8_4_;
    auVar84._12_4_ = auVar39._12_4_ * auVar75._12_4_;
    auVar81._0_4_ = auVar63._0_4_ * auVar38._0_4_;
    auVar81._4_4_ = auVar63._4_4_ * auVar38._4_4_;
    auVar81._8_4_ = auVar63._8_4_ * auVar38._8_4_;
    auVar81._12_4_ = auVar63._12_4_ * auVar38._12_4_;
    auVar38 = vsubps_avx(auVar81,auVar84);
    auVar80 = vshufps_avx(auVar38,auVar38,0xc9);
    auVar38 = vdpps_avx(auVar80,auVar80,0x7f);
    auVar39 = vrsqrtss_avx(auVar38,auVar38);
    fVar62 = auVar39._0_4_;
    auVar38 = ZEXT416((uint)(fVar62 * 1.5 - fVar62 * fVar62 * fVar62 * auVar38._0_4_ * 0.5));
    auVar38 = vshufps_avx(auVar38,auVar38,0);
    auVar39._0_4_ = auVar38._0_4_ * auVar80._0_4_;
    auVar39._4_4_ = auVar38._4_4_ * auVar80._4_4_;
    auVar39._8_4_ = auVar38._8_4_ * auVar80._8_4_;
    auVar39._12_4_ = auVar38._12_4_ * auVar80._12_4_;
    auVar38._0_4_ = auVar40._0_4_ * auVar63._0_4_;
    auVar38._4_4_ = auVar40._4_4_ * auVar63._4_4_;
    auVar38._8_4_ = auVar40._8_4_ * auVar63._8_4_;
    auVar38._12_4_ = auVar40._12_4_ * auVar63._12_4_;
    auVar80 = vunpcklps_avx(auVar75,auVar38);
    auVar38 = vunpckhps_avx(auVar75,auVar38);
    auVar40 = vunpcklps_avx(auVar39,auVar69);
    auVar39 = vunpckhps_avx(auVar39,auVar69);
    local_2430 = vunpcklps_avx(auVar38,auVar39);
    local_2450 = vunpcklps_avx(auVar80,auVar40);
    local_2440 = vunpckhps_avx(auVar80,auVar40);
    local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_2398 = 0;
    if (local_23a0 != 8) {
      auVar80 = vmaxss_avx(ZEXT816(0) << 0x20,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar40 = vmaxss_avx(ZEXT816(0) << 0x20,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      auVar64._8_4_ = 0x7fffffff;
      auVar64._0_8_ = 0x7fffffff7fffffff;
      auVar64._12_4_ = 0x7fffffff;
      auVar38 = vandps_avx((undefined1  [16])aVar3,auVar64);
      auVar70._8_4_ = 0x219392ef;
      auVar70._0_8_ = 0x219392ef219392ef;
      auVar70._12_4_ = 0x219392ef;
      auVar38 = vcmpps_avx(auVar38,auVar70,1);
      auVar71._8_4_ = 0x3f800000;
      auVar71._0_8_ = &DAT_3f8000003f800000;
      auVar71._12_4_ = 0x3f800000;
      auVar39 = vdivps_avx(auVar71,(undefined1  [16])aVar3);
      auVar76._8_4_ = 0x5d5e0b6b;
      auVar76._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar76._12_4_ = 0x5d5e0b6b;
      auVar38 = vblendvps_avx(auVar39,auVar76,auVar38);
      pauVar35 = (undefined1 (*) [16])local_2390;
      auVar72._0_4_ = auVar38._0_4_ * 0.99999964;
      auVar72._4_4_ = auVar38._4_4_ * 0.99999964;
      auVar72._8_4_ = auVar38._8_4_ * 0.99999964;
      auVar72._12_4_ = auVar38._12_4_ * 0.99999964;
      fVar62 = (ray->super_RayK<1>).org.field_0.m128[0];
      auVar82._4_4_ = fVar62;
      auVar82._0_4_ = fVar62;
      auVar82._8_4_ = fVar62;
      auVar82._12_4_ = fVar62;
      auVar82._16_4_ = fVar62;
      auVar82._20_4_ = fVar62;
      auVar82._24_4_ = fVar62;
      auVar82._28_4_ = fVar62;
      fVar1 = (ray->super_RayK<1>).org.field_0.m128[1];
      auVar85._4_4_ = fVar1;
      auVar85._0_4_ = fVar1;
      auVar85._8_4_ = fVar1;
      auVar85._12_4_ = fVar1;
      auVar85._16_4_ = fVar1;
      auVar85._20_4_ = fVar1;
      auVar85._24_4_ = fVar1;
      auVar85._28_4_ = fVar1;
      auVar65._0_4_ = auVar38._0_4_ * 1.0000004;
      auVar65._4_4_ = auVar38._4_4_ * 1.0000004;
      auVar65._8_4_ = auVar38._8_4_ * 1.0000004;
      auVar65._12_4_ = auVar38._12_4_ * 1.0000004;
      fVar2 = (ray->super_RayK<1>).org.field_0.m128[2];
      auVar86._4_4_ = fVar2;
      auVar86._0_4_ = fVar2;
      auVar86._8_4_ = fVar2;
      auVar86._12_4_ = fVar2;
      auVar86._16_4_ = fVar2;
      auVar86._20_4_ = fVar2;
      auVar86._24_4_ = fVar2;
      auVar86._28_4_ = fVar2;
      auVar38 = vshufps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0);
      register0x00001390 = auVar38;
      _local_23c0 = auVar38;
      auVar38 = vshufps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x55);
      register0x00001390 = auVar38;
      _local_23e0 = auVar38;
      auVar38 = vshufps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0xaa);
      register0x00001210 = auVar38;
      _local_2400 = auVar38;
      auVar38 = vshufps_avx(auVar72,auVar72,0);
      local_2480._16_16_ = auVar38;
      local_2480._0_16_ = auVar38;
      auVar90 = ZEXT3264(local_2480);
      auVar38 = vmovshdup_avx(auVar72);
      auVar39 = vshufps_avx(auVar72,auVar72,0x55);
      local_24a0._16_16_ = auVar39;
      local_24a0._0_16_ = auVar39;
      auVar99 = ZEXT3264(local_24a0);
      auVar39 = vshufpd_avx(auVar72,auVar72,1);
      auVar75 = vshufps_avx(auVar72,auVar72,0xaa);
      local_24c0._16_16_ = auVar75;
      local_24c0._0_16_ = auVar75;
      auVar109 = ZEXT3264(local_24c0);
      auVar75 = vshufps_avx(auVar65,auVar65,0);
      local_24e0._16_16_ = auVar75;
      local_24e0._0_16_ = auVar75;
      auVar116 = ZEXT3264(local_24e0);
      uVar33 = (ulong)(auVar72._0_4_ < 0.0) * 0x20;
      auVar75 = vshufps_avx(auVar65,auVar65,0x55);
      local_2500._16_16_ = auVar75;
      local_2500._0_16_ = auVar75;
      auVar118 = ZEXT3264(local_2500);
      auVar75 = vshufps_avx(auVar65,auVar65,0xaa);
      uVar27 = (ulong)(auVar38._0_4_ < 0.0) << 5 | 0x40;
      local_2520._16_16_ = auVar75;
      local_2520._0_16_ = auVar75;
      auVar79 = ZEXT3264(local_2520);
      uVar31 = (ulong)(auVar39._0_4_ < 0.0) << 5 | 0x80;
      auVar38 = vshufps_avx(auVar80,auVar80,0);
      local_2540._16_16_ = auVar38;
      local_2540._0_16_ = auVar38;
      auVar121 = ZEXT3264(local_2540);
      auVar38 = vshufps_avx(auVar40,auVar40,0);
      auVar37 = ZEXT3264(CONCAT1616(auVar38,auVar38));
      do {
        do {
          if (pauVar35 == (undefined1 (*) [16])&local_23a0) {
            return;
          }
          pauVar36 = pauVar35 + -1;
          pauVar35 = pauVar35 + -1;
        } while ((ray->super_RayK<1>).tfar < *(float *)(*pauVar36 + 8));
        uVar25 = *(ulong *)*pauVar35;
        do {
          if ((uVar25 & 0xf) == 0) {
            auVar7 = vsubps_avx(*(undefined1 (*) [32])(uVar25 + 0x40 + uVar33),auVar82);
            auVar10._4_4_ = auVar90._4_4_ * auVar7._4_4_;
            auVar10._0_4_ = auVar90._0_4_ * auVar7._0_4_;
            auVar10._8_4_ = auVar90._8_4_ * auVar7._8_4_;
            auVar10._12_4_ = auVar90._12_4_ * auVar7._12_4_;
            auVar10._16_4_ = auVar90._16_4_ * auVar7._16_4_;
            auVar10._20_4_ = auVar90._20_4_ * auVar7._20_4_;
            auVar10._24_4_ = auVar90._24_4_ * auVar7._24_4_;
            auVar10._28_4_ = auVar7._28_4_;
            auVar7 = vsubps_avx(*(undefined1 (*) [32])(uVar25 + 0x40 + uVar27),auVar85);
            auVar11._4_4_ = auVar99._4_4_ * auVar7._4_4_;
            auVar11._0_4_ = auVar99._0_4_ * auVar7._0_4_;
            auVar11._8_4_ = auVar99._8_4_ * auVar7._8_4_;
            auVar11._12_4_ = auVar99._12_4_ * auVar7._12_4_;
            auVar11._16_4_ = auVar99._16_4_ * auVar7._16_4_;
            auVar11._20_4_ = auVar99._20_4_ * auVar7._20_4_;
            auVar11._24_4_ = auVar99._24_4_ * auVar7._24_4_;
            auVar11._28_4_ = auVar7._28_4_;
            auVar7 = vmaxps_avx(auVar10,auVar11);
            auVar43 = vsubps_avx(*(undefined1 (*) [32])(uVar25 + 0x40 + uVar31),auVar86);
            auVar12._4_4_ = auVar109._4_4_ * auVar43._4_4_;
            auVar12._0_4_ = auVar109._0_4_ * auVar43._0_4_;
            auVar12._8_4_ = auVar109._8_4_ * auVar43._8_4_;
            auVar12._12_4_ = auVar109._12_4_ * auVar43._12_4_;
            auVar12._16_4_ = auVar109._16_4_ * auVar43._16_4_;
            auVar12._20_4_ = auVar109._20_4_ * auVar43._20_4_;
            auVar12._24_4_ = auVar109._24_4_ * auVar43._24_4_;
            auVar12._28_4_ = auVar43._28_4_;
            auVar43 = vsubps_avx(*(undefined1 (*) [32])(uVar25 + 0x40 + (uVar33 ^ 0x20)),auVar82);
            auVar13._4_4_ = auVar116._4_4_ * auVar43._4_4_;
            auVar13._0_4_ = auVar116._0_4_ * auVar43._0_4_;
            auVar13._8_4_ = auVar116._8_4_ * auVar43._8_4_;
            auVar13._12_4_ = auVar116._12_4_ * auVar43._12_4_;
            auVar13._16_4_ = auVar116._16_4_ * auVar43._16_4_;
            auVar13._20_4_ = auVar116._20_4_ * auVar43._20_4_;
            auVar13._24_4_ = auVar116._24_4_ * auVar43._24_4_;
            auVar13._28_4_ = auVar43._28_4_;
            auVar43 = vsubps_avx(*(undefined1 (*) [32])(uVar25 + 0x40 + (uVar27 ^ 0x20)),auVar85);
            auVar14._4_4_ = auVar118._4_4_ * auVar43._4_4_;
            auVar14._0_4_ = auVar118._0_4_ * auVar43._0_4_;
            auVar14._8_4_ = auVar118._8_4_ * auVar43._8_4_;
            auVar14._12_4_ = auVar118._12_4_ * auVar43._12_4_;
            auVar14._16_4_ = auVar118._16_4_ * auVar43._16_4_;
            auVar14._20_4_ = auVar118._20_4_ * auVar43._20_4_;
            auVar14._24_4_ = auVar118._24_4_ * auVar43._24_4_;
            auVar14._28_4_ = auVar43._28_4_;
            auVar50 = vminps_avx(auVar13,auVar14);
            auVar43 = vsubps_avx(*(undefined1 (*) [32])(uVar25 + 0x40 + (uVar31 ^ 0x20)),auVar86);
            auVar15._4_4_ = auVar79._4_4_ * auVar43._4_4_;
            auVar15._0_4_ = auVar79._0_4_ * auVar43._0_4_;
            auVar15._8_4_ = auVar79._8_4_ * auVar43._8_4_;
            auVar15._12_4_ = auVar79._12_4_ * auVar43._12_4_;
            auVar15._16_4_ = auVar79._16_4_ * auVar43._16_4_;
            auVar15._20_4_ = auVar79._20_4_ * auVar43._20_4_;
            auVar15._24_4_ = auVar79._24_4_ * auVar43._24_4_;
            auVar15._28_4_ = auVar43._28_4_;
            auVar43 = vmaxps_avx(auVar12,auVar121._0_32_);
            local_2560 = vmaxps_avx(auVar7,auVar43);
            auVar7 = vminps_avx(auVar15,auVar37._0_32_);
            auVar7 = vminps_avx(auVar50,auVar7);
            auVar7 = vcmpps_avx(local_2560,auVar7,2);
            uVar34 = vmovmskps_avx(auVar7);
LAB_015a7ad0:
            unaff_R13 = CONCAT44((int)(unaff_R13 >> 0x20),uVar34);
            bVar22 = true;
          }
          else {
            if ((int)(uVar25 & 0xf) == 2) {
              uVar24 = uVar25 & 0xfffffffffffffff0;
              fVar44 = *(float *)(uVar24 + 0xbc);
              auVar98._0_4_ =
                   (float)local_2400._0_4_ * *(float *)(uVar24 + 0x100) +
                   (float)local_23e0._0_4_ * *(float *)(uVar24 + 0xa0) +
                   (float)local_23c0._0_4_ * *(float *)(uVar24 + 0x40);
              auVar98._4_4_ =
                   (float)local_2400._4_4_ * *(float *)(uVar24 + 0x104) +
                   (float)local_23e0._4_4_ * *(float *)(uVar24 + 0xa4) +
                   (float)local_23c0._4_4_ * *(float *)(uVar24 + 0x44);
              auVar98._8_4_ =
                   fStack_23f8 * *(float *)(uVar24 + 0x108) +
                   fStack_23d8 * *(float *)(uVar24 + 0xa8) + fStack_23b8 * *(float *)(uVar24 + 0x48)
              ;
              auVar98._12_4_ =
                   fStack_23f4 * *(float *)(uVar24 + 0x10c) +
                   fStack_23d4 * *(float *)(uVar24 + 0xac) + fStack_23b4 * *(float *)(uVar24 + 0x4c)
              ;
              auVar98._16_4_ =
                   fStack_23f0 * *(float *)(uVar24 + 0x110) +
                   fStack_23d0 * *(float *)(uVar24 + 0xb0) + fStack_23b0 * *(float *)(uVar24 + 0x50)
              ;
              auVar98._20_4_ =
                   fStack_23ec * *(float *)(uVar24 + 0x114) +
                   fStack_23cc * *(float *)(uVar24 + 0xb4) + fStack_23ac * *(float *)(uVar24 + 0x54)
              ;
              auVar98._24_4_ =
                   fStack_23e8 * *(float *)(uVar24 + 0x118) +
                   fStack_23c8 * *(float *)(uVar24 + 0xb8) + fStack_23a8 * *(float *)(uVar24 + 0x58)
              ;
              auVar98._28_4_ = fVar1 + auVar99._28_4_ + fStack_23c4;
              auVar107._0_4_ =
                   (float)local_2400._0_4_ * *(float *)(uVar24 + 0x120) +
                   (float)local_23e0._0_4_ * *(float *)(uVar24 + 0xc0) +
                   (float)local_23c0._0_4_ * *(float *)(uVar24 + 0x60);
              auVar107._4_4_ =
                   (float)local_2400._4_4_ * *(float *)(uVar24 + 0x124) +
                   (float)local_23e0._4_4_ * *(float *)(uVar24 + 0xc4) +
                   (float)local_23c0._4_4_ * *(float *)(uVar24 + 100);
              auVar107._8_4_ =
                   fStack_23f8 * *(float *)(uVar24 + 0x128) + fStack_23d8 * *(float *)(uVar24 + 200)
                   + fStack_23b8 * *(float *)(uVar24 + 0x68);
              auVar107._12_4_ =
                   fStack_23f4 * *(float *)(uVar24 + 300) + fStack_23d4 * *(float *)(uVar24 + 0xcc)
                   + fStack_23b4 * *(float *)(uVar24 + 0x6c);
              auVar107._16_4_ =
                   fStack_23f0 * *(float *)(uVar24 + 0x130) +
                   fStack_23d0 * *(float *)(uVar24 + 0xd0) + fStack_23b0 * *(float *)(uVar24 + 0x70)
              ;
              auVar107._20_4_ =
                   fStack_23ec * *(float *)(uVar24 + 0x134) +
                   fStack_23cc * *(float *)(uVar24 + 0xd4) + fStack_23ac * *(float *)(uVar24 + 0x74)
              ;
              auVar107._24_4_ =
                   fStack_23e8 * *(float *)(uVar24 + 0x138) +
                   fStack_23c8 * *(float *)(uVar24 + 0xd8) + fStack_23a8 * *(float *)(uVar24 + 0x78)
              ;
              auVar107._28_4_ = fVar2 + auVar109._28_4_ + fStack_23c4;
              auVar89._0_4_ =
                   (float)local_2400._0_4_ * *(float *)(uVar24 + 0x140) +
                   (float)local_23e0._0_4_ * *(float *)(uVar24 + 0xe0) +
                   (float)local_23c0._0_4_ * *(float *)(uVar24 + 0x80);
              auVar89._4_4_ =
                   (float)local_2400._4_4_ * *(float *)(uVar24 + 0x144) +
                   (float)local_23e0._4_4_ * *(float *)(uVar24 + 0xe4) +
                   (float)local_23c0._4_4_ * *(float *)(uVar24 + 0x84);
              auVar89._8_4_ =
                   fStack_23f8 * *(float *)(uVar24 + 0x148) +
                   fStack_23d8 * *(float *)(uVar24 + 0xe8) + fStack_23b8 * *(float *)(uVar24 + 0x88)
              ;
              auVar89._12_4_ =
                   fStack_23f4 * *(float *)(uVar24 + 0x14c) +
                   fStack_23d4 * *(float *)(uVar24 + 0xec) + fStack_23b4 * *(float *)(uVar24 + 0x8c)
              ;
              auVar89._16_4_ =
                   fStack_23f0 * *(float *)(uVar24 + 0x150) +
                   fStack_23d0 * *(float *)(uVar24 + 0xf0) + fStack_23b0 * *(float *)(uVar24 + 0x90)
              ;
              auVar89._20_4_ =
                   fStack_23ec * *(float *)(uVar24 + 0x154) +
                   fStack_23cc * *(float *)(uVar24 + 0xf4) + fStack_23ac * *(float *)(uVar24 + 0x94)
              ;
              auVar89._24_4_ =
                   fStack_23e8 * *(float *)(uVar24 + 0x158) +
                   fStack_23c8 * *(float *)(uVar24 + 0xf8) + fStack_23a8 * *(float *)(uVar24 + 0x98)
              ;
              auVar89._28_4_ = auVar90._28_4_ + fStack_23c4 + fStack_23c4;
              auVar117._8_4_ = 0x7fffffff;
              auVar117._0_8_ = 0x7fffffff7fffffff;
              auVar117._12_4_ = 0x7fffffff;
              auVar117._16_4_ = 0x7fffffff;
              auVar117._20_4_ = 0x7fffffff;
              auVar117._24_4_ = 0x7fffffff;
              auVar117._28_4_ = 0x7fffffff;
              auVar7 = vandps_avx(auVar98,auVar117);
              auVar119._8_4_ = 0x219392ef;
              auVar119._0_8_ = 0x219392ef219392ef;
              auVar119._12_4_ = 0x219392ef;
              auVar119._16_4_ = 0x219392ef;
              auVar119._20_4_ = 0x219392ef;
              auVar119._24_4_ = 0x219392ef;
              auVar119._28_4_ = 0x219392ef;
              auVar7 = vcmpps_avx(auVar7,auVar119,1);
              auVar43 = vblendvps_avx(auVar98,auVar119,auVar7);
              auVar7 = vandps_avx(auVar107,auVar117);
              auVar7 = vcmpps_avx(auVar7,auVar119,1);
              auVar50 = vblendvps_avx(auVar107,auVar119,auVar7);
              auVar7 = vandps_avx(auVar89,auVar117);
              auVar7 = vcmpps_avx(auVar7,auVar119,1);
              auVar7 = vblendvps_avx(auVar89,auVar119,auVar7);
              auVar57 = vrcpps_avx(auVar43);
              fVar88 = auVar57._0_4_;
              fVar91 = auVar57._4_4_;
              auVar8._4_4_ = fVar91 * auVar43._4_4_;
              auVar8._0_4_ = fVar88 * auVar43._0_4_;
              fVar92 = auVar57._8_4_;
              auVar8._8_4_ = fVar92 * auVar43._8_4_;
              fVar93 = auVar57._12_4_;
              auVar8._12_4_ = fVar93 * auVar43._12_4_;
              fVar94 = auVar57._16_4_;
              auVar8._16_4_ = fVar94 * auVar43._16_4_;
              fVar95 = auVar57._20_4_;
              auVar8._20_4_ = fVar95 * auVar43._20_4_;
              fVar96 = auVar57._24_4_;
              auVar8._24_4_ = fVar96 * auVar43._24_4_;
              auVar8._28_4_ = auVar43._28_4_;
              auVar120._8_4_ = 0x3f800000;
              auVar120._0_8_ = &DAT_3f8000003f800000;
              auVar120._12_4_ = 0x3f800000;
              auVar120._16_4_ = 0x3f800000;
              auVar120._20_4_ = 0x3f800000;
              auVar120._24_4_ = 0x3f800000;
              auVar120._28_4_ = 0x3f800000;
              auVar8 = vsubps_avx(auVar120,auVar8);
              fVar88 = fVar88 + fVar88 * auVar8._0_4_;
              fVar91 = fVar91 + fVar91 * auVar8._4_4_;
              fVar92 = fVar92 + fVar92 * auVar8._8_4_;
              fVar93 = fVar93 + fVar93 * auVar8._12_4_;
              fVar94 = fVar94 + fVar94 * auVar8._16_4_;
              fVar95 = fVar95 + fVar95 * auVar8._20_4_;
              fVar96 = fVar96 + fVar96 * auVar8._24_4_;
              auVar43 = vrcpps_avx(auVar50);
              fVar97 = auVar43._0_4_;
              fVar100 = auVar43._4_4_;
              auVar9._4_4_ = fVar100 * auVar50._4_4_;
              auVar9._0_4_ = fVar97 * auVar50._0_4_;
              fVar101 = auVar43._8_4_;
              auVar9._8_4_ = fVar101 * auVar50._8_4_;
              fVar102 = auVar43._12_4_;
              auVar9._12_4_ = fVar102 * auVar50._12_4_;
              fVar103 = auVar43._16_4_;
              auVar9._16_4_ = fVar103 * auVar50._16_4_;
              fVar104 = auVar43._20_4_;
              auVar9._20_4_ = fVar104 * auVar50._20_4_;
              fVar105 = auVar43._24_4_;
              auVar9._24_4_ = fVar105 * auVar50._24_4_;
              auVar9._28_4_ = auVar50._28_4_;
              auVar9 = vsubps_avx(auVar120,auVar9);
              auVar50 = vrcpps_avx(auVar7);
              fVar97 = fVar97 + fVar97 * auVar9._0_4_;
              fVar100 = fVar100 + fVar100 * auVar9._4_4_;
              fVar101 = fVar101 + fVar101 * auVar9._8_4_;
              fVar102 = fVar102 + fVar102 * auVar9._12_4_;
              fVar103 = fVar103 + fVar103 * auVar9._16_4_;
              fVar104 = fVar104 + fVar104 * auVar9._20_4_;
              fVar105 = fVar105 + fVar105 * auVar9._24_4_;
              fVar106 = auVar50._0_4_;
              fVar110 = auVar50._4_4_;
              auVar16._4_4_ = fVar110 * auVar7._4_4_;
              auVar16._0_4_ = fVar106 * auVar7._0_4_;
              fVar111 = auVar50._8_4_;
              auVar16._8_4_ = fVar111 * auVar7._8_4_;
              fVar112 = auVar50._12_4_;
              auVar16._12_4_ = fVar112 * auVar7._12_4_;
              fVar113 = auVar50._16_4_;
              auVar16._16_4_ = fVar113 * auVar7._16_4_;
              fVar114 = auVar50._20_4_;
              auVar16._20_4_ = fVar114 * auVar7._20_4_;
              fVar115 = auVar50._24_4_;
              auVar16._24_4_ = fVar115 * auVar7._24_4_;
              auVar16._28_4_ = auVar9._28_4_;
              auVar7 = vsubps_avx(auVar120,auVar16);
              fVar106 = fVar106 + fVar106 * auVar7._0_4_;
              fVar110 = fVar110 + fVar110 * auVar7._4_4_;
              fVar111 = fVar111 + fVar111 * auVar7._8_4_;
              fVar112 = fVar112 + fVar112 * auVar7._12_4_;
              fVar113 = fVar113 + fVar113 * auVar7._16_4_;
              fVar114 = fVar114 + fVar114 * auVar7._20_4_;
              fVar115 = fVar115 + fVar115 * auVar7._24_4_;
              fVar61 = *(float *)(uVar24 + 0x5c) +
                       fVar44 + *(float *)(uVar24 + 0x11c) + *(float *)(uVar24 + 0x17c);
              auVar55._0_4_ =
                   -fVar88 * (*(float *)(uVar24 + 0x40) * fVar62 +
                             *(float *)(uVar24 + 0xa0) * fVar1 +
                             *(float *)(uVar24 + 0x100) * fVar2 + *(float *)(uVar24 + 0x160));
              auVar55._4_4_ =
                   -fVar91 * (*(float *)(uVar24 + 0x44) * fVar62 +
                             *(float *)(uVar24 + 0xa4) * fVar1 +
                             *(float *)(uVar24 + 0x104) * fVar2 + *(float *)(uVar24 + 0x164));
              auVar55._8_4_ =
                   -fVar92 * (*(float *)(uVar24 + 0x48) * fVar62 +
                             *(float *)(uVar24 + 0xa8) * fVar1 +
                             *(float *)(uVar24 + 0x108) * fVar2 + *(float *)(uVar24 + 0x168));
              auVar55._12_4_ =
                   -fVar93 * (*(float *)(uVar24 + 0x4c) * fVar62 +
                             *(float *)(uVar24 + 0xac) * fVar1 +
                             *(float *)(uVar24 + 0x10c) * fVar2 + *(float *)(uVar24 + 0x16c));
              fVar58 = -fVar94 * (*(float *)(uVar24 + 0x50) * fVar62 +
                                 *(float *)(uVar24 + 0xb0) * fVar1 +
                                 *(float *)(uVar24 + 0x110) * fVar2 + *(float *)(uVar24 + 0x170));
              auVar17._16_4_ = fVar58;
              auVar17._0_16_ = auVar55;
              fVar59 = -fVar95 * (*(float *)(uVar24 + 0x54) * fVar62 +
                                 *(float *)(uVar24 + 0xb4) * fVar1 +
                                 *(float *)(uVar24 + 0x114) * fVar2 + *(float *)(uVar24 + 0x174));
              auVar17._20_4_ = fVar59;
              fVar60 = -fVar96 * (*(float *)(uVar24 + 0x58) * fVar62 +
                                 *(float *)(uVar24 + 0xb8) * fVar1 +
                                 *(float *)(uVar24 + 0x118) * fVar2 + *(float *)(uVar24 + 0x178));
              auVar17._24_4_ = fVar60;
              auVar17._28_4_ = fVar61;
              fVar54 = *(float *)(uVar24 + 0x7c) +
                       fVar44 + *(float *)(uVar24 + 0x13c) + *(float *)(uVar24 + 0x19c);
              auVar48._0_4_ =
                   -fVar97 * (*(float *)(uVar24 + 0x60) * fVar62 +
                             *(float *)(uVar24 + 0xc0) * fVar1 +
                             *(float *)(uVar24 + 0x120) * fVar2 + *(float *)(uVar24 + 0x180));
              auVar48._4_4_ =
                   -fVar100 *
                   (*(float *)(uVar24 + 100) * fVar62 +
                   *(float *)(uVar24 + 0xc4) * fVar1 +
                   *(float *)(uVar24 + 0x124) * fVar2 + *(float *)(uVar24 + 0x184));
              auVar48._8_4_ =
                   -fVar101 *
                   (*(float *)(uVar24 + 0x68) * fVar62 +
                   *(float *)(uVar24 + 200) * fVar1 +
                   *(float *)(uVar24 + 0x128) * fVar2 + *(float *)(uVar24 + 0x188));
              auVar48._12_4_ =
                   -fVar102 *
                   (*(float *)(uVar24 + 0x6c) * fVar62 +
                   *(float *)(uVar24 + 0xcc) * fVar1 +
                   *(float *)(uVar24 + 300) * fVar2 + *(float *)(uVar24 + 0x18c));
              fVar51 = -fVar103 *
                       (*(float *)(uVar24 + 0x70) * fVar62 +
                       *(float *)(uVar24 + 0xd0) * fVar1 +
                       *(float *)(uVar24 + 0x130) * fVar2 + *(float *)(uVar24 + 400));
              auVar18._16_4_ = fVar51;
              auVar18._0_16_ = auVar48;
              fVar52 = -fVar104 *
                       (*(float *)(uVar24 + 0x74) * fVar62 +
                       *(float *)(uVar24 + 0xd4) * fVar1 +
                       *(float *)(uVar24 + 0x134) * fVar2 + *(float *)(uVar24 + 0x194));
              auVar18._20_4_ = fVar52;
              fVar53 = -fVar105 *
                       (*(float *)(uVar24 + 0x78) * fVar62 +
                       *(float *)(uVar24 + 0xd8) * fVar1 +
                       *(float *)(uVar24 + 0x138) * fVar2 + *(float *)(uVar24 + 0x198));
              auVar18._24_4_ = fVar53;
              auVar18._28_4_ = fVar54;
              fVar47 = *(float *)(uVar24 + 0x9c) +
                       fVar44 + *(float *)(uVar24 + 0x15c) + *(float *)(uVar24 + 0x1bc);
              auVar40._0_4_ =
                   -fVar106 *
                   (*(float *)(uVar24 + 0x80) * fVar62 +
                   *(float *)(uVar24 + 0xe0) * fVar1 +
                   *(float *)(uVar24 + 0x140) * fVar2 + *(float *)(uVar24 + 0x1a0));
              auVar40._4_4_ =
                   -fVar110 *
                   (*(float *)(uVar24 + 0x84) * fVar62 +
                   *(float *)(uVar24 + 0xe4) * fVar1 +
                   *(float *)(uVar24 + 0x144) * fVar2 + *(float *)(uVar24 + 0x1a4));
              auVar40._8_4_ =
                   -fVar111 *
                   (*(float *)(uVar24 + 0x88) * fVar62 +
                   *(float *)(uVar24 + 0xe8) * fVar1 +
                   *(float *)(uVar24 + 0x148) * fVar2 + *(float *)(uVar24 + 0x1a8));
              auVar40._12_4_ =
                   -fVar112 *
                   (*(float *)(uVar24 + 0x8c) * fVar62 +
                   *(float *)(uVar24 + 0xec) * fVar1 +
                   *(float *)(uVar24 + 0x14c) * fVar2 + *(float *)(uVar24 + 0x1ac));
              fVar44 = -fVar113 *
                       (*(float *)(uVar24 + 0x90) * fVar62 +
                       *(float *)(uVar24 + 0xf0) * fVar1 +
                       *(float *)(uVar24 + 0x150) * fVar2 + *(float *)(uVar24 + 0x1b0));
              auVar19._16_4_ = fVar44;
              auVar19._0_16_ = auVar40;
              fVar45 = -fVar114 *
                       (*(float *)(uVar24 + 0x94) * fVar62 +
                       *(float *)(uVar24 + 0xf4) * fVar1 +
                       *(float *)(uVar24 + 0x154) * fVar2 + *(float *)(uVar24 + 0x1b4));
              auVar19._20_4_ = fVar45;
              fVar46 = -fVar115 *
                       (*(float *)(uVar24 + 0x98) * fVar62 +
                       *(float *)(uVar24 + 0xf8) * fVar1 +
                       *(float *)(uVar24 + 0x158) * fVar2 + *(float *)(uVar24 + 0x1b8));
              auVar19._24_4_ = fVar46;
              auVar19._28_4_ = fVar47;
              auVar73._0_4_ = fVar88 + auVar55._0_4_;
              auVar73._4_4_ = fVar91 + auVar55._4_4_;
              auVar73._8_4_ = fVar92 + auVar55._8_4_;
              auVar73._12_4_ = fVar93 + auVar55._12_4_;
              auVar74._16_4_ = fVar94 + fVar58;
              auVar74._0_16_ = auVar73;
              auVar74._20_4_ = fVar95 + fVar59;
              auVar74._24_4_ = fVar96 + fVar60;
              auVar74._28_4_ = auVar57._28_4_ + auVar8._28_4_ + fVar61;
              auVar77._0_4_ = fVar97 + auVar48._0_4_;
              auVar77._4_4_ = fVar100 + auVar48._4_4_;
              auVar77._8_4_ = fVar101 + auVar48._8_4_;
              auVar77._12_4_ = fVar102 + auVar48._12_4_;
              auVar78._16_4_ = fVar103 + fVar51;
              auVar78._0_16_ = auVar77;
              auVar78._20_4_ = fVar104 + fVar52;
              auVar78._24_4_ = fVar105 + fVar53;
              auVar78._28_4_ = auVar43._28_4_ + auVar9._28_4_ + fVar54;
              auVar66._0_4_ = fVar106 + auVar40._0_4_;
              auVar66._4_4_ = fVar110 + auVar40._4_4_;
              auVar66._8_4_ = fVar111 + auVar40._8_4_;
              auVar66._12_4_ = fVar112 + auVar40._12_4_;
              auVar68._16_4_ = fVar113 + fVar44;
              auVar68._0_16_ = auVar66;
              auVar68._20_4_ = fVar114 + fVar45;
              auVar68._24_4_ = fVar115 + fVar46;
              auVar68._28_4_ = auVar50._28_4_ + auVar7._28_4_ + fVar47;
              auVar38 = vpminsd_avx(auVar17._16_16_,auVar74._16_16_);
              auVar39 = vpminsd_avx(auVar55,auVar73);
              local_2420._16_16_ = auVar38;
              local_2420._0_16_ = auVar39;
              auVar38 = vpminsd_avx(auVar18._16_16_,auVar78._16_16_);
              auVar39 = vpminsd_avx(auVar48,auVar77);
              auVar108._16_16_ = auVar38;
              auVar108._0_16_ = auVar39;
              auVar38 = vpminsd_avx(auVar19._16_16_,auVar68._16_16_);
              auVar39 = vpminsd_avx(auVar40,auVar66);
              auVar87._16_16_ = auVar38;
              auVar87._0_16_ = auVar39;
              auVar121 = ZEXT3264(local_2540);
              auVar7 = vmaxps_avx(auVar108,auVar87);
              auVar109 = ZEXT3264(local_24c0);
              auVar38 = vpmaxsd_avx(auVar17._16_16_,auVar74._16_16_);
              auVar39 = vpmaxsd_avx(auVar55,auVar73);
              auVar57._16_16_ = auVar38;
              auVar57._0_16_ = auVar39;
              auVar38 = vpmaxsd_avx(auVar18._16_16_,auVar78._16_16_);
              auVar99 = ZEXT3264(local_24a0);
              auVar90 = ZEXT3264(local_2480);
              auVar39 = vpmaxsd_avx(auVar48,auVar77);
              auVar79 = ZEXT3264(local_2520);
              auVar50._16_16_ = auVar38;
              auVar50._0_16_ = auVar39;
              auVar38 = vpmaxsd_avx(auVar19._16_16_,auVar68._16_16_);
              auVar118 = ZEXT3264(local_2500);
              auVar116 = ZEXT3264(local_24e0);
              auVar39 = vpmaxsd_avx(auVar40,auVar66);
              auVar43._16_16_ = auVar38;
              auVar43._0_16_ = auVar39;
              auVar50 = vminps_avx(auVar50,auVar43);
              auVar43 = vmaxps_avx(local_2540,local_2420);
              auVar7 = vmaxps_avx(auVar43,auVar7);
              auVar43 = vminps_avx(auVar37._0_32_,auVar57);
              auVar43 = vminps_avx(auVar43,auVar50);
              local_2560._4_4_ = auVar7._4_4_ * 0.99999964;
              local_2560._0_4_ = auVar7._0_4_ * 0.99999964;
              local_2560._8_4_ = auVar7._8_4_ * 0.99999964;
              local_2560._12_4_ = auVar7._12_4_ * 0.99999964;
              local_2560._16_4_ = auVar7._16_4_ * 0.99999964;
              local_2560._20_4_ = auVar7._20_4_ * 0.99999964;
              local_2560._24_4_ = auVar7._24_4_ * 0.99999964;
              local_2560._28_4_ = auVar7._28_4_;
              auVar7._4_4_ = auVar43._4_4_ * 1.0000004;
              auVar7._0_4_ = auVar43._0_4_ * 1.0000004;
              auVar7._8_4_ = auVar43._8_4_ * 1.0000004;
              auVar7._12_4_ = auVar43._12_4_ * 1.0000004;
              auVar7._16_4_ = auVar43._16_4_ * 1.0000004;
              auVar7._20_4_ = auVar43._20_4_ * 1.0000004;
              auVar7._24_4_ = auVar43._24_4_ * 1.0000004;
              auVar7._28_4_ = auVar43._28_4_;
              auVar7 = vcmpps_avx(local_2560,auVar7,2);
              uVar34 = vmovmskps_avx(auVar7);
              goto LAB_015a7ad0;
            }
            bVar22 = false;
          }
          if (bVar22) {
            if (unaff_R13 == 0) {
              iVar23 = 4;
            }
            else {
              uVar24 = uVar25 & 0xfffffffffffffff0;
              lVar26 = 0;
              if (unaff_R13 != 0) {
                for (; (unaff_R13 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
                }
              }
              iVar23 = 0;
              uVar25 = *(ulong *)(uVar24 + lVar26 * 8);
              uVar32 = unaff_R13 - 1 & unaff_R13;
              if (uVar32 != 0) {
                uVar4 = *(uint *)(local_2560 + lVar26 * 4);
                lVar26 = 0;
                if (uVar32 != 0) {
                  for (; (uVar32 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
                  }
                }
                uVar6 = *(ulong *)(uVar24 + lVar26 * 8);
                uVar5 = *(uint *)(local_2560 + lVar26 * 4);
                uVar32 = uVar32 - 1 & uVar32;
                if (uVar32 == 0) {
                  if (uVar4 < uVar5) {
                    *(ulong *)*pauVar35 = uVar6;
                    *(uint *)(*pauVar35 + 8) = uVar5;
                    pauVar35 = pauVar35 + 1;
                  }
                  else {
                    *(ulong *)*pauVar35 = uVar25;
                    *(uint *)(*pauVar35 + 8) = uVar4;
                    uVar25 = uVar6;
                    pauVar35 = pauVar35 + 1;
                  }
                }
                else {
                  auVar41._8_8_ = 0;
                  auVar41._0_8_ = uVar25;
                  auVar38 = vpunpcklqdq_avx(auVar41,ZEXT416(uVar4));
                  auVar49._8_8_ = 0;
                  auVar49._0_8_ = uVar6;
                  auVar39 = vpunpcklqdq_avx(auVar49,ZEXT416(uVar5));
                  lVar26 = 0;
                  if (uVar32 != 0) {
                    for (; (uVar32 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
                    }
                  }
                  auVar56._8_8_ = 0;
                  auVar56._0_8_ = *(ulong *)(uVar24 + lVar26 * 8);
                  auVar80 = vpunpcklqdq_avx(auVar56,ZEXT416(*(uint *)(local_2560 + lVar26 * 4)));
                  uVar32 = uVar32 - 1 & uVar32;
                  if (uVar32 == 0) {
                    auVar40 = vpcmpgtd_avx(auVar39,auVar38);
                    auVar75 = vpshufd_avx(auVar40,0xaa);
                    auVar40 = vblendvps_avx(auVar39,auVar38,auVar75);
                    auVar38 = vblendvps_avx(auVar38,auVar39,auVar75);
                    auVar39 = vpcmpgtd_avx(auVar80,auVar40);
                    auVar75 = vpshufd_avx(auVar39,0xaa);
                    auVar39 = vblendvps_avx(auVar80,auVar40,auVar75);
                    auVar80 = vblendvps_avx(auVar40,auVar80,auVar75);
                    auVar40 = vpcmpgtd_avx(auVar80,auVar38);
                    auVar75 = vpshufd_avx(auVar40,0xaa);
                    auVar40 = vblendvps_avx(auVar80,auVar38,auVar75);
                    auVar38 = vblendvps_avx(auVar38,auVar80,auVar75);
                    *pauVar35 = auVar38;
                    pauVar35[1] = auVar40;
                    uVar25 = auVar39._0_8_;
                    pauVar35 = pauVar35 + 2;
                  }
                  else {
                    lVar26 = 0;
                    if (uVar32 != 0) {
                      for (; (uVar32 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
                      }
                    }
                    auVar67._8_8_ = 0;
                    auVar67._0_8_ = *(ulong *)(uVar24 + lVar26 * 8);
                    auVar40 = vpunpcklqdq_avx(auVar67,ZEXT416(*(uint *)(local_2560 + lVar26 * 4)));
                    uVar32 = uVar32 - 1 & uVar32;
                    if (uVar32 == 0) {
                      auVar75 = vpcmpgtd_avx(auVar39,auVar38);
                      auVar69 = vpshufd_avx(auVar75,0xaa);
                      auVar75 = vblendvps_avx(auVar39,auVar38,auVar69);
                      auVar38 = vblendvps_avx(auVar38,auVar39,auVar69);
                      auVar39 = vpcmpgtd_avx(auVar40,auVar80);
                      auVar69 = vpshufd_avx(auVar39,0xaa);
                      auVar39 = vblendvps_avx(auVar40,auVar80,auVar69);
                      auVar80 = vblendvps_avx(auVar80,auVar40,auVar69);
                      auVar40 = vpcmpgtd_avx(auVar80,auVar38);
                      auVar69 = vpshufd_avx(auVar40,0xaa);
                      auVar40 = vblendvps_avx(auVar80,auVar38,auVar69);
                      auVar38 = vblendvps_avx(auVar38,auVar80,auVar69);
                      auVar80 = vpcmpgtd_avx(auVar39,auVar75);
                      auVar69 = vpshufd_avx(auVar80,0xaa);
                      auVar80 = vblendvps_avx(auVar39,auVar75,auVar69);
                      auVar39 = vblendvps_avx(auVar75,auVar39,auVar69);
                      auVar75 = vpcmpgtd_avx(auVar40,auVar39);
                      auVar69 = vpshufd_avx(auVar75,0xaa);
                      auVar75 = vblendvps_avx(auVar40,auVar39,auVar69);
                      auVar39 = vblendvps_avx(auVar39,auVar40,auVar69);
                      *pauVar35 = auVar38;
                      pauVar35[1] = auVar39;
                      pauVar35[2] = auVar75;
                      uVar25 = auVar80._0_8_;
                      pauVar36 = pauVar35 + 3;
                    }
                    else {
                      *pauVar35 = auVar38;
                      pauVar35[1] = auVar39;
                      pauVar35[2] = auVar80;
                      pauVar35[3] = auVar40;
                      lVar26 = 0x30;
                      do {
                        lVar29 = lVar26;
                        lVar26 = 0;
                        if (uVar32 != 0) {
                          for (; (uVar32 >> lVar26 & 1) == 0; lVar26 = lVar26 + 1) {
                          }
                        }
                        auVar42._8_8_ = 0;
                        auVar42._0_8_ = *(ulong *)(uVar24 + lVar26 * 8);
                        auVar38 = vpunpcklqdq_avx(auVar42,ZEXT416(*(uint *)(local_2560 + lVar26 * 4)
                                                                 ));
                        *(undefined1 (*) [16])(pauVar35[1] + lVar29) = auVar38;
                        uVar32 = uVar32 & uVar32 - 1;
                        lVar26 = lVar29 + 0x10;
                      } while (uVar32 != 0);
                      pauVar36 = (undefined1 (*) [16])(pauVar35[1] + lVar29);
                      if (lVar29 + 0x10 != 0) {
                        lVar26 = 0x10;
                        pauVar28 = pauVar35;
                        do {
                          uVar20 = *(undefined8 *)pauVar28[1];
                          uVar21 = *(undefined8 *)(pauVar28[1] + 8);
                          uVar4 = *(uint *)(pauVar28[1] + 8);
                          pauVar28 = pauVar28 + 1;
                          lVar29 = lVar26;
                          do {
                            if (uVar4 <= *(uint *)(pauVar35[-1] + lVar29 + 8)) {
                              pauVar30 = (undefined1 (*) [16])(*pauVar35 + lVar29);
                              break;
                            }
                            *(undefined1 (*) [16])(*pauVar35 + lVar29) =
                                 *(undefined1 (*) [16])(pauVar35[-1] + lVar29);
                            lVar29 = lVar29 + -0x10;
                            pauVar30 = pauVar35;
                          } while (lVar29 != 0);
                          *(undefined8 *)*pauVar30 = uVar20;
                          *(undefined8 *)(*pauVar30 + 8) = uVar21;
                          lVar26 = lVar26 + 0x10;
                        } while (pauVar36 != pauVar28);
                      }
                      uVar25 = *(ulong *)*pauVar36;
                    }
                    auVar79 = ZEXT3264(auVar79._0_32_);
                    auVar121 = ZEXT3264(local_2540);
                    pauVar35 = pauVar36;
                  }
                }
              }
            }
          }
          else {
            iVar23 = 6;
          }
        } while (iVar23 == 0);
        if (iVar23 == 6) {
          (**(code **)((long)This->leafIntersector +
                      (ulong)*(byte *)(uVar25 & 0xfffffffffffffff0) * 0x40))(local_2460,ray,context)
          ;
          auVar121 = ZEXT3264(local_2540);
          auVar79 = ZEXT3264(local_2520);
          auVar118 = ZEXT3264(local_2500);
          auVar116 = ZEXT3264(local_24e0);
          auVar109 = ZEXT3264(local_24c0);
          auVar99 = ZEXT3264(local_24a0);
          auVar90 = ZEXT3264(local_2480);
          fVar44 = (ray->super_RayK<1>).tfar;
          auVar37 = ZEXT3264(CONCAT428(fVar44,CONCAT424(fVar44,CONCAT420(fVar44,CONCAT416(fVar44,
                                                  CONCAT412(fVar44,CONCAT48(fVar44,CONCAT44(fVar44,
                                                  fVar44))))))));
        }
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }